

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotPieChart<signed_char>
               (char **label_ids,char *values,int count,double x,double y,double radius,
               bool normalize,char *fmt,double angle0)

{
  char cVar1;
  double dVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  ImU32 IVar8;
  ImDrawList *this;
  ImPlotItem *pIVar9;
  ulong uVar10;
  int i_1;
  ulong uVar11;
  int i;
  double dVar12;
  double dVar13;
  double local_d0;
  undefined8 local_c8;
  double local_b0;
  float local_98;
  float fStack_94;
  ImPlotPoint center;
  ImVec2 local_60;
  char buffer [32];
  
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotPieChart() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/implot/implot_items.cpp"
                  ,0x63c,
                  "void ImPlot::PlotPieChart(const char *const *, const T *, int, double, double, double, bool, const char *, double) [T = signed char]"
                 );
  }
  this = GetPlotDrawList();
  uVar10 = 0;
  uVar11 = (ulong)(uint)count;
  if (count < 1) {
    uVar11 = uVar10;
  }
  local_d0 = 0.0;
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    local_d0 = local_d0 + (double)(int)values[uVar10];
  }
  center.x = x;
  center.y = y;
  PushPlotClipRect();
  local_b0 = local_d0;
  if (!normalize && local_d0 <= 1.0) {
    local_b0 = 1.0;
  }
  local_c8 = ((angle0 + angle0) * 3.1415927410125732) / 360.0;
  dVar12 = local_c8;
  for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    cVar1 = values[uVar10];
    dVar2 = ((double)(int)cVar1 / local_b0) * 6.2831854820251465 + dVar12;
    bVar7 = BeginItem(label_ids[uVar10],-1);
    if (bVar7) {
      IVar8 = ImGui::GetColorU32(&GImPlot->CurrentItem->Color);
      if (0.5 <= (double)(int)cVar1 / local_b0) {
        dVar13 = (dVar2 - dVar12) * 0.5 + dVar12;
        RenderPieSlice(this,&center,radius,dVar12,dVar13,IVar8);
        dVar12 = dVar13;
      }
      RenderPieSlice(this,&center,radius,dVar12,dVar2,IVar8);
      EndItem();
    }
    dVar12 = dVar2;
  }
  if (fmt != (char *)0x0) {
    if (!normalize && local_d0 <= 1.0) {
      local_d0 = 1.0;
    }
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      pIVar9 = GetItem(label_ids[uVar10]);
      dVar12 = ((double)(int)values[uVar10] / local_d0) * 6.2831854820251465 + local_c8;
      if (pIVar9->Show == true) {
        sprintf(buffer,fmt,SUB84((double)(int)values[uVar10],0));
        IVar3 = ImGui::CalcTextSize(buffer,(char *)0x0,false,-1.0);
        dVar5 = center.x;
        local_c8 = (dVar12 - local_c8) * 0.5 + local_c8;
        dVar2 = cos(local_c8);
        dVar6 = center.y;
        dVar13 = sin(local_c8);
        IVar4 = PlotToPixels(dVar2 * radius * 0.5 + dVar5,dVar6 + dVar13 * radius * 0.5,-1);
        IVar8 = CalcTextColor(&pIVar9->Color);
        local_98 = IVar3.x;
        fStack_94 = IVar3.y;
        local_c8._0_4_ = IVar4.x;
        local_c8._4_4_ = IVar4.y;
        local_60.y = fStack_94 * -0.5 + local_c8._4_4_;
        local_60.x = local_98 * -0.5 + (float)local_c8;
        ImDrawList::AddText(this,&local_60,IVar8,buffer,(char *)0x0);
      }
      local_c8 = dVar12;
    }
  }
  PopPlotClipRect();
  return;
}

Assistant:

void PlotPieChart(const char* const label_ids[], const T* values, int count, double x, double y, double radius, bool normalize, const char* fmt, double angle0) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotPieChart() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    double sum = 0;
    for (int i = 0; i < count; ++i)
        sum += (double)values[i];
    normalize = normalize || sum > 1.0;
    ImPlotPoint center(x,y);
    PushPlotClipRect();
    double a0 = angle0 * 2 * IM_PI / 360.0;
    double a1 = angle0 * 2 * IM_PI / 360.0;
    for (int i = 0; i < count; ++i) {
        double percent = normalize ? (double)values[i] / sum : (double)values[i];
        a1 = a0 + 2 * IM_PI * percent;
        if (BeginItem(label_ids[i])) {
            ImU32 col = ImGui::GetColorU32(GetCurrentItem()->Color);
            if (percent < 0.5) {
                RenderPieSlice(DrawList, center, radius, a0, a1, col);
            }
            else  {
                RenderPieSlice(DrawList, center, radius, a0, a0 + (a1 - a0) * 0.5, col);
                RenderPieSlice(DrawList, center, radius, a0 + (a1 - a0) * 0.5, a1, col);
            }
            EndItem();
        }
        a0 = a1;
    }
    if (fmt != NULL) {
        a0 = angle0 * 2 * IM_PI / 360.0;
        a1 = angle0 * 2 * IM_PI / 360.0;
        char buffer[32];
        for (int i = 0; i < count; ++i) {
            ImPlotItem* item = GetItem(label_ids[i]);
            double percent = normalize ? (double)values[i] / sum : (double)values[i];
            a1 = a0 + 2 * IM_PI * percent;
            if (item->Show) {
                sprintf(buffer, fmt, (double)values[i]);
                ImVec2 size = ImGui::CalcTextSize(buffer);
                double angle = a0 + (a1 - a0) * 0.5;
                ImVec2 pos = PlotToPixels(center.x + 0.5 * radius * cos(angle), center.y + 0.5 * radius * sin(angle));
                ImU32 col = CalcTextColor(item->Color);
                DrawList.AddText(pos - size * 0.5f, col, buffer);
            }
            a0 = a1;
        }
    }
    PopPlotClipRect();
}